

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

bool __thiscall
QTableModel::setItemData(QTableModel *this,QModelIndex *index,QMap<int,_QVariant> *roles)

{
  _Rb_tree_color _Var1;
  char cVar2;
  bool bVar3;
  QTableWidget *this_00;
  QTableWidgetItem *pQVar4;
  _Base_ptr p_Var5;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar6;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar7;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar10;
  long in_FS_OFFSET;
  QList<int> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = false;
  if (((-1 < index->r) && (bVar3 = false, -1 < index->c)) &&
     (bVar3 = false, (index->m).ptr != (QAbstractItemModel *)0x0)) {
    this_00 = (QTableWidget *)QMetaObject::cast((QObject *)&QTableWidget::staticMetaObject);
    pQVar4 = item(this,index);
    if (pQVar4 == (QTableWidgetItem *)0x0) {
      if (this_00 == (QTableWidget *)0x0) {
        bVar3 = false;
        goto LAB_00592439;
      }
      pQVar4 = createItem(this);
      pQVar7 = (roles->d).d.ptr;
      if (pQVar7 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        pQVar6 = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                  *)0x0;
      }
      else {
        pQVar6 = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                  *)(pQVar7->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      pQVar10 = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                 *)&(pQVar7->m)._M_t._M_impl.super__Rb_tree_header;
      if (pQVar7 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        pQVar10 = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                   *)0x0;
      }
      if (pQVar6 != pQVar10) {
        do {
          (*pQVar4->_vptr_QTableWidgetItem[4])
                    (pQVar4,(ulong)*(uint *)&(pQVar6->m)._M_t._M_impl.super__Rb_tree_header.
                                             _M_header._M_left,
                     &(pQVar6->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
          pQVar6 = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                    *)std::_Rb_tree_increment((_Rb_tree_node_base *)pQVar6);
          pQVar7 = (roles->d).d.ptr;
          if (pQVar7 != (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                         *)0x0) {
            pQVar7 = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                      *)&(pQVar7->m)._M_t._M_impl.super__Rb_tree_header;
          }
        } while (pQVar6 != pQVar7);
      }
      QTableWidget::setItem(this_00,index->r,index->c,pQVar4);
    }
    else {
      p_Var5 = (_Base_ptr)0x0;
      pQVar4->view = (QTableWidget *)0x0;
      local_78.d.size = 0;
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (int *)0x0;
      pQVar7 = (roles->d).d.ptr;
      if (pQVar7 != (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        p_Var5 = (pQVar7->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      p_Var8 = &(pQVar7->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar7 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        p_Var8 = (_Base_ptr)0x0;
      }
      if (p_Var5 == p_Var8) {
        pQVar4->view = this_00;
      }
      else {
        do {
          _Var1 = p_Var5[1]._M_color;
          if (p_Var5[1]._M_color == 2) {
            _Var1 = _S_red;
          }
          (*pQVar4->_vptr_QTableWidgetItem[3])(&local_58,pQVar4,(ulong)_Var1);
          cVar2 = ::QVariant::equals((QVariant *)&local_58);
          ::QVariant::~QVariant((QVariant *)&local_58);
          if (cVar2 == '\0') {
            (*pQVar4->_vptr_QTableWidgetItem[4])(pQVar4,(ulong)_Var1,&p_Var5[1]._M_parent);
            local_58._0_4_ = _Var1;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)local_58.data);
            QList<int>::end(&local_78);
            if (_Var1 == _S_red) {
              local_58._0_4_ = 2;
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)local_58.data);
              QList<int>::end(&local_78);
            }
          }
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
          pQVar7 = (roles->d).d.ptr;
          p_Var9 = &(pQVar7->m)._M_t._M_impl.super__Rb_tree_header._M_header;
          if (pQVar7 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                         *)0x0) {
            p_Var9 = (_Rb_tree_node_base *)0x0;
          }
        } while (p_Var5 != p_Var9);
        pQVar4->view = this_00;
        if (local_78.d.size != 0) {
          itemChanged(this,pQVar4,&local_78);
        }
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
        }
      }
    }
    bVar3 = true;
  }
LAB_00592439:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QTableModel::setItemData(const QModelIndex &index, const QMap<int, QVariant> &roles)
{
    if (!index.isValid())
        return false;

    QTableWidget *view = this->view();
    QTableWidgetItem *itm = item(index);
    if (itm) {
        itm->view = nullptr; // prohibits item from calling itemChanged()
        QList<int> rolesVec;
        for (QMap<int, QVariant>::ConstIterator it = roles.constBegin(); it != roles.constEnd(); ++it) {
            const int role = (it.key() == Qt::EditRole ? Qt::DisplayRole : it.key());
            if (itm->data(role) != it.value()) {
                itm->setData(role, it.value());
                rolesVec += role;
                if (role == Qt::DisplayRole)
                    rolesVec += Qt::EditRole;
            }
        }
        itm->view = view;
        if (!rolesVec.isEmpty())
            itemChanged(itm, rolesVec);
        return true;
    }

    if (!view)
        return false;

    itm = createItem();
    for (QMap<int, QVariant>::ConstIterator it = roles.constBegin(); it != roles.constEnd(); ++it)
        itm->setData(it.key(), it.value());
    view->setItem(index.row(), index.column(), itm);
    return true;
}